

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnu_gettext.h
# Opt level: O0

void __thiscall booster::locale::gnu_gettext::messages_info::~messages_info(messages_info *this)

{
  string *in_RDI;
  vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  *unaff_retaddr;
  
  std::
  function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::vector<char,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x270a6f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)unaff_retaddr);
  std::
  vector<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI + 0x80);
  std::__cxx11::string::~string(in_RDI + 0x60);
  std::__cxx11::string::~string(in_RDI + 0x40);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

messages_info() :
            language("C"),
            locale_category("LC_MESSAGES")
        {
        }